

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList_item * isSelfJoinView(SrcList *pTabList,SrcList_item *pThis)

{
  int iVar1;
  Parse *pA;
  Parse *in_RSI;
  long in_RDI;
  SrcList_item *pItem;
  Expr *in_stack_ffffffffffffffd8;
  
  pA = (Parse *)(in_RDI + 8);
  while( true ) {
    if (in_RSI <= pA) {
      return (SrcList_item *)0x0;
    }
    if ((((*(Select **)&pA->nRangeReg != (Select *)0x0) &&
         (((byte)((anon_struct_4_7_7ffbf296_for_fg *)&pA->nOpAlloc)->field_0x1 >> 4 & 1) == 0)) &&
        (pA->pVdbe != (Vdbe *)0x0)) &&
       (((iVar1 = sqlite3_stricmp((char *)in_stack_ffffffffffffffd8,(char *)0x1b365c), iVar1 == 0 &&
         (iVar1 = sqlite3_stricmp((char *)in_stack_ffffffffffffffd8,(char *)0x1b367a), iVar1 == 0))
        && (iVar1 = sqlite3ExprCompare(in_RSI,(Expr *)pA,in_stack_ffffffffffffffd8,0), iVar1 == 0)))
       ) break;
    pA = (Parse *)&pA->writeMask;
  }
  return (SrcList_item *)pA;
}

Assistant:

static struct SrcList_item *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  struct SrcList_item *pThis   /* Search for prior reference to this subquery */
){
  struct SrcList_item *pItem;
  for(pItem = pTabList->a; pItem<pThis; pItem++){
    if( pItem->pSelect==0 ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    if( sqlite3_stricmp(pItem->zDatabase, pThis->zDatabase)!=0 ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    if( sqlite3ExprCompare(0, 
          pThis->pSelect->pWhere, pItem->pSelect->pWhere, -1) 
    ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}